

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Mesh::Mesh(Mesh *this,PolymeshInfo *polyMesh,Matrix4x4 *transform)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  DiffuseBSDF *this_00;
  Skeleton *this_01;
  Vector3D local_120;
  Vector3D local_108;
  Spectrum local_ec;
  Vector4D local_e0;
  Vector4D local_c0;
  Vector3D local_a0;
  int local_84;
  undefined1 local_80 [4];
  int i;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> vertices;
  Polygon *p;
  iterator __end2;
  iterator __begin2;
  vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_> *__range2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygons;
  Matrix4x4 *transform_local;
  PolymeshInfo *polyMesh_local;
  Mesh *this_local;
  
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00394548;
  HalfedgeMesh::HalfedgeMesh(&this->mesh);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector(&this->bevelVertices);
  Vector3D::Vector3D(&this->beveledVertexPos);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector(&this->beveledEdgePos);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector(&this->beveledFacePos);
  MeshResampler::MeshResampler((MeshResampler *)&this->field_0x1e8);
  std::
  map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
  ::map(&this->idToElement);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)&__range2);
  __end2 = std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>::begin
                     (&polyMesh->polygons);
  p = (Polygon *)
      std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>::end
                (&polyMesh->polygons);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<CMU462::Collada::Polygon_*,_std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>_>
                                *)&p);
    if (!bVar1) break;
    vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<CMU462::Collada::Polygon_*,_std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>_>
                  ::operator*(&__end2);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&__range2,
                (value_type *)
                vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<CMU462::Collada::Polygon_*,_std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>_>
    ::operator++(&__end2);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_80,
             &polyMesh->vertices);
  local_84 = 0;
  while( true ) {
    uVar2 = (ulong)local_84;
    sVar3 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size
                      ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_80);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_80,
                        (long)local_84);
    Vector4D::Vector4D(&local_e0,pvVar4,1.0);
    Matrix4x4::operator*(&local_c0,transform,&local_e0);
    Vector4D::projectTo3D(&local_a0,&local_c0);
    pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_80,
                        (long)local_84);
    pvVar4->x = local_a0.x;
    pvVar4->y = local_a0.y;
    pvVar4->z = local_a0.z;
    local_84 = local_84 + 1;
  }
  HalfedgeMesh::build(&this->mesh,
                      (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)&__range2,
                      (vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_80);
  if (polyMesh->material == (MaterialInfo *)0x0) {
    this_00 = (DiffuseBSDF *)operator_new(0x28);
    Spectrum::Spectrum(&local_ec,1.0,1.0,1.0);
    DiffuseBSDF::DiffuseBSDF(this_00,&local_ec);
    this->bsdf = (BSDF *)this_00;
  }
  else {
    this->bsdf = polyMesh->material->bsdf;
  }
  Vector3D::Vector3D(&local_108,1.0,1.0,1.0);
  (this->super_SceneObject).scale.z = local_108.z;
  (this->super_SceneObject).scale.x = local_108.x;
  (this->super_SceneObject).scale.y = local_108.y;
  Vector3D::Vector3D(&local_120,&(this->super_SceneObject).scale);
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).scales,0.0,&local_120);
  this_01 = (Skeleton *)operator_new(0x1e0);
  Skeleton::Skeleton(this_01,this);
  this->skeleton = this_01;
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)local_80);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&__range2);
  return;
}

Assistant:

Mesh::Mesh( Collada::PolymeshInfo& polyMesh, const Matrix4x4& transform)
{
   // Build halfedge mesh from polygon soup
   vector< vector<size_t> > polygons;
   for (const Collada::Polygon& p : polyMesh.polygons) {
      polygons.push_back(p.vertex_indices);
   }
   vector<Vector3D> vertices = polyMesh.vertices; // DELIBERATE COPY.
   for (int i = 0; i < vertices.size(); i++) {
      vertices[i] = (transform * Vector4D(vertices[i], 1)).projectTo3D();
   }

   mesh.build(polygons, vertices);  
   if (polyMesh.material) {
      bsdf = polyMesh.material->bsdf;
   } else {
//      bsdf = new DiffuseBSDF(Spectrum(0.5f,0.5f,0.5f));
      bsdf = new DiffuseBSDF(Spectrum(1., 1., 1.));
   }

   scale = Vector3D(1., 1., 1.);
   scales.setValue(0, scale);

   skeleton = new Skeleton(this);
}